

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printNEONModImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  uint64_t uVar4;
  uint64_t Val;
  uint EltBits;
  uint EncodedImm;
  SStream *O_local;
  MCInst *pMStack_10;
  uint OpNum_local;
  MCInst *MI_local;
  
  _EltBits = O;
  O_local._4_4_ = OpNum;
  pMStack_10 = MI;
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  Val._4_4_ = (uint)iVar3;
  uVar4 = ARM_AM_decodeNEONModImm(Val._4_4_,(uint *)&Val);
  if (uVar4 < 10) {
    SStream_concat(_EltBits,"#%lu",uVar4);
  }
  else {
    SStream_concat(_EltBits,"#0x%lx",uVar4);
  }
  if (pMStack_10->csh->detail != CS_OPT_OFF) {
    puVar1 = pMStack_10->flat_insn->detail->groups +
             (ulong)(pMStack_10->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(pMStack_10->flat_insn->detail->groups +
            (ulong)(pMStack_10->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = (int)uVar4
    ;
    pcVar2 = pMStack_10->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printNEONModImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned EncodedImm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned EltBits;
	uint64_t Val = ARM_AM_decodeNEONModImm(EncodedImm, &EltBits);
	if (Val > HEX_THRESHOLD)
		SStream_concat(O, "#0x%"PRIx64, Val);
	else
		SStream_concat(O, "#%"PRIu64, Val);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = (unsigned int)Val;
		MI->flat_insn->detail->arm.op_count++;
	}
}